

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O0

void test_short_writes(void)

{
  checker *pcVar1;
  int local_801c;
  char local_8018 [4];
  int i;
  uint16_t test_data [16384];
  checker *checker;
  
  for (local_801c = 0; local_801c < 0x4000; local_801c = local_801c + 1) {
    *(short *)(local_8018 + (long)local_801c * 2) = (short)local_801c;
  }
  pcVar1 = checker_new(1);
  checker_add_file(pcVar1,"a",local_8018,0x400);
  checker_close(pcVar1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'Ã',(uint)(0x400 < pcVar1->shortbuf_len),"checker->shortbuf_len > 1024",
                   (void *)0x0);
  checker_check(pcVar1);
  checker_free(pcVar1);
  pcVar1 = checker_new(1);
  checker_add_file(pcVar1,"a",local_8018,0x5400);
  checker_close(pcVar1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'Î',(uint)(0x5400 < pcVar1->shortbuf_len),"checker->shortbuf_len > 21 * 1024",
                   (void *)0x0);
  checker_check(pcVar1);
  checker_free(pcVar1);
  pcVar1 = checker_new(0);
  checker_add_file(pcVar1,"a",local_8018,0x400);
  checker_close(pcVar1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'×',(uint)(0x400 < pcVar1->shortbuf_len),"checker->shortbuf_len > 1024",
                   (void *)0x0);
  checker_check(pcVar1);
  checker_free(pcVar1);
  return;
}

Assistant:

DEFINE_TEST(test_short_writes)
{
        struct checker *checker;
        uint16_t test_data[16384];
        int i;

        for (i = 0; i < 16384; i++)
                test_data[i] = i;


        /* Write a file smaller than the default buffer size (10 * 1024);
         * this will be written out at close.
         */
        checker = checker_new(1);
        checker_add_file(checker, "a", (char *)test_data, 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 1024);
        checker_check(checker);
        checker_free(checker);

        /* Write a file larger larger than twice default buffer size (10 * 1024);
         * this both fills the buffer and writes it out, and also exercises
         * the "write out full blocks directly" code path.
         */
        checker = checker_new(1);
        checker_add_file(checker, "a", (char *)test_data, 21 * 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 21 * 1024);
        checker_check(checker);
        checker_free(checker);

        /* Test unbuffered writes - a different code path.
         */
        checker = checker_new(0);
        checker_add_file(checker, "a", (char *)test_data, 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 1024);
        checker_check(checker);
        checker_free(checker);
}